

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPrintVisitor.cpp
# Opt level: O0

void __thiscall CPrintVisitor::AddLabel(CPrintVisitor *this,string *label)

{
  string local_58 [32];
  undefined1 local_38 [40];
  string *label_local;
  CPrintVisitor *this_local;
  
  local_38._32_8_ = label;
  label_local = (string *)this;
  std::__cxx11::string::string(local_58,(string *)label);
  ConstructLabel((CPrintVisitor *)local_38,(string *)this,(int)local_58);
  std::__cxx11::string::operator+=((string *)&this->description,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void CPrintVisitor::AddLabel(std::string label) {
	this->description += ConstructLabel(label, lastVisited + 1);
}